

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTreeTest.cc
# Opt level: O3

void run_basic_test(void)

{
  long lVar1;
  long lVar2;
  __normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_> _Var3;
  undefined8 *puVar4;
  bool bVar5;
  Entry *__dest;
  long *plVar6;
  size_type sVar7;
  pair<phosg::Vector2<long>,_long> *it;
  anon_union_8_2_94730018_for_Vector2<long>_1 aVar8;
  KDTree<phosg::Vector2<long>,_long> *__range1;
  char *pcVar9;
  KDTree<phosg::Vector2<long>,_long> t;
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries_1;
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries;
  Iterator __end1;
  KDTree<phosg::Vector2<long>,_long> local_408;
  __normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_> local_3f0;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_3e8;
  undefined8 uStack_3e0;
  _Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_> *local_3d8
  ;
  long local_3c0;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_3b0;
  anon_union_8_2_94730038_for_Vector2<long>_3 local_3a8;
  _Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_> *local_3a0
  ;
  anon_union_8_2_94730038_for_Vector2<long>_3 *local_398;
  anon_union_8_2_94730038_for_Vector2<long>_3 *local_390;
  long local_388;
  long *local_380;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_348;
  undefined8 *puStack_340;
  long *local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  long *local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  __normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_> local_2e0;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  _Any_data local_2c0;
  code *local_2b0;
  code *local_2a8;
  Iterator local_2a0;
  Iterator local_238;
  Iterator local_1d0;
  Iterator local_168;
  Iterator local_100;
  Iterator local_98;
  
  puts("-- basic");
  puts("--   construction");
  local_408.root = (Node *)0x0;
  local_408.node_count = 0;
  phosg::expect_generic
            (true,"t.size() != 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x5e);
  __dest = (Entry *)operator_new(0x90);
  memcpy(__dest,&DAT_0011b5e0,0x90);
  puts("--   insert");
  local_3b0.x = 2;
  local_3a8.y = 3;
  local_348.x = 0;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_98,&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_98);
  local_3b0.x = 5;
  local_3a8.y = 4;
  local_348.x = 1;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_100,&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_100);
  local_3b0.x = 9;
  local_3a8.y = 6;
  local_348.x = 2;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_168,&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_168);
  local_3b0.x = 4;
  local_3a8.y = 7;
  local_348.x = 3;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_1d0,&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_1d0);
  local_3b0.x = 8;
  local_3a8.y = 1;
  local_348.x = (long)&DAT_00000004;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_238,&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_238);
  local_3b0.x = 7;
  local_3a8.y = 2;
  local_348.x = 5;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_2a0,&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_2a0);
  puts("--   at/exists");
  phosg::expect_generic
            (local_408.node_count == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x87);
  local_3b0.x = 8;
  local_3a8.y = 1;
  plVar6 = phosg::KDTree<phosg::Vector2<long>,_long>::at(&local_408,(Vector2<long> *)&local_3b0);
  phosg::expect_generic
            (*plVar6 == 4,"4 != t.at({8, 1})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x88);
  local_2c0._8_8_ = 0;
  local_2a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc:137:3)>
              ::_M_invoke;
  local_2b0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc:137:3)>
              ::_M_manager;
  local_3f0._M_current = __dest;
  local_2c0._M_unused._M_object = &local_408;
  phosg::expect_raises_fn<std::out_of_range>
            ("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8b,(function<void_()> *)&local_2c0);
  if (local_2b0 != (code *)0x0) {
    (*local_2b0)(&local_2c0,&local_2c0,__destroy_functor);
  }
  local_3b0.x = 5;
  local_3a8.y = 4;
  bVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::exists(&local_408,(Vector2<long> *)&local_3b0);
  phosg::expect_generic
            (bVar5,"true != t.exists({5, 4})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8c);
  local_3b0.x = 5;
  local_3a8.y = 3;
  bVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::exists(&local_408,(Vector2<long> *)&local_3b0);
  phosg::expect_generic
            (!bVar5,"false != t.exists({5, 3})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8d);
  puts("--   within");
  local_398 = &local_3a8;
  local_3a8.y = local_3a8.y & 0xffffffff00000000;
  local_3a0 = (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
               *)0x0;
  local_388 = 0;
  local_348.x = 2;
  puStack_340 = (undefined8 *)0x3;
  local_338 = (long *)0x0;
  local_390 = local_398;
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3b0,
             (value_type *)&local_348);
  local_348.x = (long)&DAT_00000004;
  puStack_340 = (undefined8 *)0x7;
  local_338 = (long *)0x3;
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3b0,
             (value_type *)&local_348);
  local_3e8.x = 0;
  uStack_3e0 = 0;
  local_2d8.x = 5;
  uStack_2d0 = 10;
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            ((vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
              *)&local_348,&local_408,(Vector2<long> *)&local_3e8,(Vector2<long> *)&local_2d8);
  puVar4 = puStack_340;
  if ((undefined8 *)local_348.x != puStack_340) {
    aVar8 = local_348;
    do {
      local_3e8.x = *aVar8.x;
      uStack_3e0 = *(undefined8 *)(aVar8.x + 8);
      local_3d8 = *(_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
                    **)(aVar8.x + 0x10);
      sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                        ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3b0,
                         (key_type *)&local_3e8);
      phosg::expect_generic
                (sVar7 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x95);
      aVar8.x = aVar8.x + 0x18;
    } while ((undefined8 *)aVar8.x != puVar4);
  }
  _Var3._M_current = local_3f0._M_current;
  if ((undefined8 *)local_348.x != (undefined8 *)0x0) {
    operator_delete((void *)local_348,(long)local_338 - (long)local_348);
  }
  pcVar9 = "0 != remaining_entries.size()";
  phosg::expect_generic
            (local_388 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x97);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  _M_erase(local_3a0,(_Link_type)pcVar9);
  puts("--   erase");
  local_3b0.x = 8;
  local_3a8.y = 6;
  local_348.x = 2;
  bVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    (&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  phosg::expect_generic
            (!bVar5,"false != t.erase({8, 6}, 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9b);
  phosg::expect_generic
            (local_408.node_count == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9c);
  local_3b0.x = 9;
  local_3a8.y = 6;
  local_348.x = 1;
  bVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    (&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  phosg::expect_generic
            (!bVar5,"false != t.erase({9, 6}, 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9d);
  phosg::expect_generic
            (local_408.node_count == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9e);
  local_3b0.x = 9;
  local_3a8.y = 6;
  local_348.x = 2;
  bVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    (&local_408,(Vector2<long> *)&local_3b0,&local_348.x);
  phosg::expect_generic
            (bVar5,"true != t.erase({9, 6}, 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9f);
  phosg::expect_generic
            (local_408.node_count == 5,"5 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa0);
  puts("--   iterate");
  local_2e0._M_current = _Var3._M_current + 6;
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)&local_3e8,_Var3,_Var3._M_current + 6);
  local_3b0.x = 9;
  local_3a8.y = 6;
  local_3a0 = (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
               *)0x2;
  sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3e8,
                     (key_type *)&local_3b0);
  phosg::expect_generic
            (sVar7 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa5);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&local_3b0,local_408.root);
  local_308 = 0;
  uStack_300 = 0;
  local_318 = (long *)0x0;
  uStack_310 = 0;
  local_328 = 0;
  uStack_320 = 0;
  local_338 = (long *)0x0;
  uStack_330 = 0;
  local_348.x = 0;
  puStack_340 = (undefined8 *)0x0;
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::_M_initialize_map((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                       *)&local_348,0);
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  while ((local_318 != local_338 ||
          (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_> *
          )local_380 != local_3a0 &&
         ((((_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
             *)local_380 == local_3a0) != (local_318 == local_338) ||
          (*(long *)local_3a0 != *local_338))))) {
    local_2d8 = local_360;
    uStack_2d0 = uStack_358;
    local_2c8 = local_350;
    sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3e8,
                       (key_type *)&local_2d8);
    phosg::expect_generic
              (sVar7 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xa7);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&local_3b0);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_348);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_3b0);
  pcVar9 = "0 != remaining_entries.size()";
  phosg::expect_generic
            (local_3c0 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa9);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  _M_erase(local_3d8,(_Link_type)pcVar9);
  puts("--   iterate+erase");
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)&local_3e8,_Var3,local_2e0);
  local_3b0.x = 9;
  local_3a8.y = 6;
  local_3a0 = (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
               *)0x2;
  sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3e8,
                     (key_type *)&local_3b0);
  phosg::expect_generic
            (sVar7 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xaf);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&local_3b0,local_408.root);
  while( true ) {
    local_308 = 0;
    uStack_300 = 0;
    local_318 = (long *)0x0;
    uStack_310 = 0;
    local_328 = 0;
    uStack_320 = 0;
    local_338 = (long *)0x0;
    uStack_330 = 0;
    local_348.x = 0;
    puStack_340 = (undefined8 *)0x0;
    std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::_M_initialize_map((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                         *)&local_348,0);
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_2e8 = 0;
    if (local_318 == local_338 &&
        (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_> *)
        local_380 == local_3a0) break;
    if (((_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_> *)
         local_380 == local_3a0) == (local_318 == local_338)) {
      lVar1 = *(long *)local_3a0;
      lVar2 = *local_338;
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_348);
      if (lVar1 == lVar2) goto LAB_00107035;
    }
    else {
      std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                      *)&local_348);
    }
    local_348.x = local_360.x;
    puStack_340 = (undefined8 *)uStack_358;
    local_338 = (long *)local_350;
    sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3e8,
                       (key_type *)&local_348);
    phosg::expect_generic
              (sVar7 == 1,"1 != remaining_entries.erase({it->first.x, it->first.y, it->second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xb1);
    if (local_360.x == 4) {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance(&local_408,(Iterator *)&local_3b0);
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&local_3b0);
    }
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_348);
LAB_00107035:
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_3b0);
  pcVar9 = "0 != remaining_entries.size()";
  phosg::expect_generic
            (local_3c0 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xb8);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  _M_erase(local_3d8,(_Link_type)pcVar9);
  puts("--   ensure committed (iterate)");
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)&local_3e8,local_3f0,local_2e0);
  local_3b0.x = 9;
  local_3a8.y = 6;
  local_3a0 = (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
               *)0x2;
  sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3e8,
                     (key_type *)&local_3b0);
  phosg::expect_generic
            (sVar7 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xbe);
  local_3b0.x = 4;
  local_3a8.y = 7;
  local_3a0 = (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
               *)0x3;
  sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3e8,
                     (key_type *)&local_3b0);
  phosg::expect_generic
            (sVar7 == 1,"1 != remaining_entries.erase({4, 7, 3})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xbf);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&local_3b0,local_408.root);
  local_308 = 0;
  uStack_300 = 0;
  local_318 = (long *)0x0;
  uStack_310 = 0;
  local_328 = 0;
  uStack_320 = 0;
  local_338 = (long *)0x0;
  uStack_330 = 0;
  local_348.x = 0;
  puStack_340 = (undefined8 *)0x0;
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::_M_initialize_map((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                       *)&local_348,0);
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  while ((local_318 != local_338 ||
          (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_> *
          )local_380 != local_3a0 &&
         ((((_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
             *)local_380 == local_3a0) != (local_318 == local_338) ||
          (*(long *)local_3a0 != *local_338))))) {
    local_2d8 = local_360;
    uStack_2d0 = uStack_358;
    local_2c8 = local_350;
    sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3e8,
                       (key_type *)&local_2d8);
    phosg::expect_generic
              (sVar7 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xc1);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&local_3b0);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_348);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_3b0);
  pcVar9 = "0 != remaining_entries.size()";
  phosg::expect_generic
            (local_3c0 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xc3);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  _M_erase(local_3d8,(_Link_type)pcVar9);
  puts("--   ensure committed (within)");
  local_3a8.y = local_3a8.y & 0xffffffff00000000;
  local_3a0 = (_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
               *)0x0;
  local_398 = &local_3a8;
  local_388 = 0;
  local_348.x = 2;
  puStack_340 = (undefined8 *)0x3;
  local_338 = (long *)0x0;
  local_390 = local_398;
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3b0,
             (value_type *)&local_348);
  local_3e8.x = 0;
  uStack_3e0 = 0;
  local_2d8.x = 5;
  uStack_2d0 = 10;
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            ((vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
              *)&local_348,&local_408,(Vector2<long> *)&local_3e8,(Vector2<long> *)&local_2d8);
  puVar4 = puStack_340;
  if ((undefined8 *)local_348.x != puStack_340) {
    aVar8 = local_348;
    do {
      local_3e8.x = *aVar8.x;
      uStack_3e0 = *(undefined8 *)(aVar8.x + 8);
      local_3d8 = *(_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>
                    **)(aVar8.x + 0x10);
      sVar7 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                        ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)&local_3b0,
                         (key_type *)&local_3e8);
      phosg::expect_generic
                (sVar7 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0xcb);
      aVar8.x = aVar8.x + 0x18;
    } while ((undefined8 *)aVar8.x != puVar4);
  }
  _Var3._M_current = local_3f0._M_current;
  if ((undefined8 *)local_348.x != (undefined8 *)0x0) {
    operator_delete((void *)local_348,(long)local_338 - (long)local_348);
  }
  pcVar9 = "0 != remaining_entries.size()";
  phosg::expect_generic
            (local_388 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xcd);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  _M_erase(local_3a0,(_Link_type)pcVar9);
  operator_delete(_Var3._M_current,0x90);
  phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree(&local_408);
  return;
}

Assistant:

void run_basic_test() {
  printf("-- basic\n");

  printf("--   construction\n");

  KDTree<Vector2<int64_t>, int64_t> t;
  expect_eq(t.size(), 0);

  struct Entry {
    int64_t x;
    int64_t y;
    int64_t v;

    bool operator<(const Entry& other) const {
      if (this->x < other.x) {
        return true;
      }
      if (this->x > other.x) {
        return false;
      }
      if (this->y < other.y) {
        return true;
      }
      if (this->y > other.y) {
        return false;
      }
      return (this->v < other.v);
    }
  };
  const vector<Entry> entries({
      {2, 3, 0},
      {5, 4, 1},
      {9, 6, 2},
      {4, 7, 3},
      {8, 1, 4},
      {7, 2, 5},
  });

  printf("--   insert\n");
  t.insert({2, 3}, 0);
  t.insert({5, 4}, 1);
  t.insert({9, 6}, 2);
  t.insert({4, 7}, 3);
  t.insert({8, 1}, 4);
  t.insert({7, 2}, 5);

  printf("--   at/exists\n");
  expect_eq(6, t.size());
  expect_eq(4, t.at({8, 1}));
  expect_raises(out_of_range, [&]() {
    t.at({8, 2});
  });
  expect_eq(true, t.exists({5, 4}));
  expect_eq(false, t.exists({5, 3}));

  printf("--   within\n");
  {
    set<Entry> remaining_entries;
    remaining_entries.insert({2, 3, 0});
    remaining_entries.insert({4, 7, 3});
    for (const auto& it : t.within({0, 0}, {5, 10})) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   erase\n");
  expect_eq(false, t.erase({8, 6}, 2));
  expect_eq(6, t.size());
  expect_eq(false, t.erase({9, 6}, 1));
  expect_eq(6, t.size());
  expect_eq(true, t.erase({9, 6}, 2));
  expect_eq(5, t.size());

  printf("--   iterate\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    for (const auto& it : t) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   iterate+erase\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, remaining_entries.erase({it->first.x, it->first.y, it->second}));
      if (it->first.x == 4) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   ensure committed (iterate)\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    expect_eq(1, remaining_entries.erase({4, 7, 3}));
    for (const auto& it : t) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   ensure committed (within)\n");
  {
    set<Entry> remaining_entries;
    remaining_entries.insert({2, 3, 0});
    for (const auto& it : t.within({0, 0}, {5, 10})) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }
}